

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

int cargo_parse(cargo_t ctx,cargo_flags_t flags,int start_index,int argc,char **argv)

{
  cargo_flags_t cVar1;
  char *pcVar2;
  cargo_parse_result_t cVar3;
  cargo_flags_t cVar4;
  cargo_parse_result_t cVar5;
  char **ppcVar6;
  int *piVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  char **ppcVar12;
  int iVar13;
  char **argv_00;
  ulong uVar14;
  size_t sVar15;
  cargo_opt_t *opt;
  cargo_opt_t *local_38;
  
  ppcVar12 = (char **)(ulong)(uint)argc;
  local_38 = (cargo_opt_t *)0x0;
  cVar1 = ctx->flags;
  if (flags != 0) {
    ctx->flags = flags;
  }
  ctx->argc = argc;
  ctx->argv = argv;
  ctx->start = start_index;
  ctx->stopped = 0;
  ctx->stopped_hard = 0;
  pcVar2 = ctx->error;
  argv_00 = argv;
  if (pcVar2 != (char *)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(pcVar2);
    }
    else {
      (*replaced_cargo_free)(pcVar2);
    }
  }
  ctx->error = (char *)0x0;
  _cargo_add_help_if_missing(ctx);
  _cargo_add_orphans_to_default_group(ctx);
  ppcVar6 = ctx->args;
  if (ppcVar6 != (char **)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(ppcVar6);
    }
    else {
      (*replaced_cargo_free)(ppcVar6);
    }
    ctx->args = (char **)0x0;
  }
  ctx->arg_count = 0;
  ppcVar6 = ctx->unknown_opts;
  if (ppcVar6 != (char **)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(ppcVar6);
    }
    else {
      (*replaced_cargo_free)(ppcVar6);
    }
    ctx->unknown_opts = (char **)0x0;
  }
  piVar7 = ctx->unknown_opts_idxs;
  if (piVar7 != (int *)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(piVar7);
    }
    else {
      (*replaced_cargo_free)(piVar7);
    }
    ctx->unknown_opts_idxs = (int *)0x0;
  }
  ctx->unknown_opts_count = 0;
  _cargo_cleanup_option_values(ctx,0);
  sVar15 = (size_t)argc;
  ppcVar6 = (char **)_cargo_calloc(sVar15,8);
  ctx->args = ppcVar6;
  cVar5 = CARGO_PARSE_NOMEM;
  if (ppcVar6 != (char **)0x0) {
    ppcVar6 = (char **)_cargo_calloc(sVar15,8);
    ctx->unknown_opts = ppcVar6;
    if (ppcVar6 != (char **)0x0) {
      piVar7 = (int *)_cargo_calloc(sVar15,4);
      ctx->unknown_opts_idxs = piVar7;
      if (piVar7 != (int *)0x0) {
        if ((ctx->flags & (CARGO_SKIP_CHECK_UNKNOWN|CARGO_UNKNOWN_EARLY)) == CARGO_UNKNOWN_EARLY) {
          cVar3 = _cargo_check_unknown_options(ctx);
          cVar5 = CARGO_PARSE_UNKNOWN_OPTS;
          if (cVar3 != CARGO_PARSE_OK) goto LAB_00105880;
        }
        iVar13 = ctx->start;
        ctx->i = iVar13;
        if (iVar13 < ctx->argc) {
          do {
            lVar8 = (long)iVar13;
            if (ctx->stopped == 0) {
              pcVar2 = argv[lVar8];
              pcVar9 = _cargo_find_full_option(ctx,&local_38,pcVar2);
              if (pcVar9 == (char *)0x0) {
                pcVar10 = _cargo_is_arg_combined_option(ctx,pcVar2);
                if (pcVar10 == (char *)0x0) {
                  local_38 = ctx->options;
                  for (ppcVar12 = (char **)ctx->opt_count; ppcVar12 != (char **)0x0;
                      ppcVar12 = (char **)((long)ppcVar12 - 1)) {
                    if ((local_38->positional != 0) && (local_38->num_eaten != local_38->nargs))
                    goto LAB_0010594f;
                    local_38 = local_38 + 1;
                  }
                  lVar8 = (long)ctx->i;
                  local_38 = ctx->options;
                  goto LAB_00105902;
                }
                sVar11 = strlen(pcVar2);
                cVar5 = CARGO_PARSE_OK;
                if (1 < sVar11) {
                  uVar14 = 1;
                  do {
                    pcVar9 = _cargo_find_short_option(ctx,&local_38,pcVar2[uVar14]);
                    if (pcVar9 == (char *)0x0) {
                      __assert_fail("combined != NULL",
                                    "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                                    ,0x1456,
                                    "int cargo_parse(cargo_t, cargo_flags_t, int, int, char **)");
                    }
                    cVar5 = _cargo_parse_option(ctx,local_38,pcVar9,(int)ppcVar12,argv_00);
                    if (cVar5 < CARGO_PARSE_OK) goto LAB_00105880;
                    uVar14 = uVar14 + 1;
                    sVar11 = strlen(pcVar2);
                  } while (uVar14 < sVar11);
                }
              }
              else {
LAB_0010594f:
                cVar5 = _cargo_parse_option(ctx,local_38,pcVar9,(int)ppcVar12,argv_00);
                if (cVar5 < CARGO_PARSE_OK) goto LAB_00105880;
              }
            }
            else {
LAB_00105902:
              ppcVar12 = ctx->args;
              sVar15 = ctx->arg_count;
              ppcVar12[sVar15] = ctx->argv[lVar8];
              ctx->arg_count = sVar15 + 1;
              cVar5 = CARGO_PARSE_SHOW_HELP;
            }
            iVar13 = cVar5 + (uint)(cVar5 == CARGO_PARSE_OK) + ctx->i;
            ctx->i = iVar13;
          } while (iVar13 < ctx->argc);
        }
        if (ctx->help != 0) {
          cargo_fprint_usage(ctx,_stdout,CARGO_USAGE_FULL);
          cVar3 = CARGO_PARSE_SHOW_HELP;
          goto LAB_001058cc;
        }
        cVar3 = CARGO_PARSE_OK;
        if (ctx->stopped_hard != 0) goto LAB_001058cc;
        cVar4 = ctx->flags;
        if ((cVar4 >> 0xb & 1) == 0) {
          iVar13 = _cargo_check_required_options(ctx);
          cVar5 = CARGO_PARSE_MISS_REQUIRED;
          if (iVar13 != 0) goto LAB_00105880;
          cVar4 = ctx->flags;
        }
        if ((cVar4 >> 0xc & 1) == 0) {
          cVar5 = _cargo_check_mutex_groups(ctx);
          if (cVar5 != CARGO_PARSE_OK) goto LAB_00105880;
          cVar4 = ctx->flags;
        }
        if ((cVar4 >> 0xd & 1) == 0) {
          cVar5 = _cargo_check_unknown_options_after(ctx);
          if (cVar5 != CARGO_PARSE_OK) goto LAB_00105880;
          cVar4 = ctx->flags;
        }
        cVar3 = CARGO_PARSE_OK;
        if ((cVar4 >> 8 & 1) == 0) {
          _cargo_parse_show_error(ctx);
        }
        goto LAB_001058cc;
      }
    }
  }
LAB_00105880:
  if (((ctx->unknown_opts_count == 0) && ((ctx->flags >> 0xd & 1) == 0)) &&
     ((ctx->flags >> 9 & 1) == 0)) {
    if (ctx->stopped == 0) {
      ctx->stopped = ctx->argc;
    }
    cVar3 = _cargo_check_unknown_options(ctx);
    if (cVar3 == CARGO_PARSE_OK) goto LAB_001058b4;
  }
  else {
LAB_001058b4:
    cVar3 = cVar5;
  }
  _cargo_parse_show_error(ctx);
  _cargo_cleanup_option_values(ctx,1);
LAB_001058cc:
  ctx->flags = cVar1;
  return cVar3;
}

Assistant:

int cargo_parse(cargo_t ctx, cargo_flags_t flags, int start_index, int argc, char **argv)
{
    int ret = CARGO_PARSE_OK;
    int start = 0;
    int opt_arg_count = 0;
    char *arg = NULL;
    const char *name = NULL;
    cargo_opt_t *opt = NULL;
    cargo_flags_t global_flags = ctx->flags;
    assert(ctx);

    // Override if any flags are set.
    if (flags)
    {
        ctx->flags = flags;
    }

    CARGODBG(2, "============ Cargo Parse =============\n");

    ctx->argc = argc;
    ctx->argv = argv;
    ctx->start = start_index;
    ctx->stopped = 0;
    ctx->stopped_hard = 0;

    _cargo_set_error(ctx, NULL);

    _cargo_add_help_if_missing(ctx);
    _cargo_add_orphans_to_default_group(ctx);

    _cargo_free_str_list(&ctx->args, NULL);
    ctx->arg_count = 0;

    _cargo_free_str_list(&ctx->unknown_opts, NULL);
    _cargo_xfree(&ctx->unknown_opts_idxs);
    ctx->unknown_opts_count = 0;

    // Make sure we start over, if this function is
    // called more than once.
    // (But we don't free the values since we don't want to
    //  overwrite default or already parsed values)
    _cargo_cleanup_option_values(ctx, 0);

    // TODO: Handle the case when argc == 0 (this will fail then).
    if (!(ctx->args = (char **)_cargo_calloc(argc, sizeof(char *))))
    {
        CARGODBG(1, "Out of memory!\n");
        ret = CARGO_PARSE_NOMEM; goto fail;
    }

    if (!(ctx->unknown_opts = (char **)_cargo_calloc(argc, sizeof(char *))))
    {
        CARGODBG(1, "Out of memory!\n");
        ret = CARGO_PARSE_NOMEM; goto fail;
    }

    if (!(ctx->unknown_opts_idxs = _cargo_calloc(argc, sizeof(int))))
    {
        CARGODBG(1, "Out of memory");
        ret = CARGO_PARSE_NOMEM; goto fail;
    }

    CARGODBG(2, "Parse arg list of count %d start at index %d\n", argc, start_index);

    // Check for unknown options early.
    if (!(ctx->flags & CARGO_SKIP_CHECK_UNKNOWN)
        && (ctx->flags & CARGO_UNKNOWN_EARLY)
        && _cargo_check_unknown_options(ctx))
    {
        ret = CARGO_PARSE_UNKNOWN_OPTS; goto fail;
    }

    for (ctx->i = ctx->start; ctx->i < ctx->argc; )
    {
        arg = argv[ctx->i];
        start = ctx->i;
        opt_arg_count = 0;

        CARGODBG(3, "\n");
        CARGODBG(3, "argv[%d] = %s\n", ctx->i, arg);
        CARGODBG(3, "  Look for opt matching %s:\n", arg);

        // TODO: Add support for a "--" option which forces all
        // options specified after it to be parsed as positional arguments
        // and not options. Say there's a file named "-thefile".

        // TODO: Add support for abbreviated prefix matching so that
        // --ar will match --arne unless it's ambigous with some other option.
        if (!ctx->stopped)
        {
            size_t opt_i = 0;
            int is_positional = 0;
            int is_combined = 0;

            // Look for options "--myoption 1 2 3"
            if (!(name = _cargo_find_full_option(ctx, &opt, arg)))
            {
                // Is this a set of combined short options?
                // -a -b -c -> -abc
                if ((is_combined = (_cargo_is_arg_combined_option(ctx, arg) != NULL)))
                {
                    size_t i;
                    const char *combined = NULL;

                    // Skip '-' by starting at 1.
                    for (i = 1; i < strlen(arg); i++)
                    {
                        combined = _cargo_find_short_option(ctx, &opt, arg[i]);
                        assert(combined != NULL);

                        if ((opt_arg_count = _cargo_parse_option(ctx, opt, combined,
                                                                argc, argv)) < 0)
                        {
                            CARGODBG(1, "Failed to parse %s option: %s\n",
                                    _cargo_type_to_str(opt->type), opt->name[0]);
                            ret = opt_arg_count; goto fail;
                        }
                    }
                }
                else
                {
                    // Or a positional argument "1 2 3"
                    // (just an argument that is parsed into a specific options target)
                    is_positional = !_cargo_get_positional(ctx, &opt_i);
                    opt = &ctx->options[opt_i];
                    CARGODBG(2, "    Positional argument: %s\n", argv[ctx->i]);
                }
            }

            if (name || is_positional)
            {
                // We found an option, parse any arguments it might have.
                if ((opt_arg_count = _cargo_parse_option(ctx, opt, name,
                                                        argc, argv)) < 0)
                {
                    CARGODBG(1, "Failed to parse %s option: %s\n",
                            _cargo_type_to_str(opt->type), opt->name[0]);
                    ret = opt_arg_count; goto fail;
                }
            }
            else if (!is_combined)
            {
                // A leftover argument that no option wants.
                opt_arg_count = _cargo_add_extra_arg(ctx);
            }
        }
        else
        {
            // Stopped parsing, so everything is saved as extra arguments.
            opt_arg_count = _cargo_add_extra_arg(ctx);
        }

        if (opt_arg_count == 0)
            opt_arg_count = 1;

        CARGODBG(3, "opt_arg_count == %d\n", opt_arg_count);

        ctx->i += opt_arg_count;

        #if CARGO_DEBUG
        _cargo_debug_print_eaten_args(ctx, start, opt_arg_count);
        #endif // CARGO_DEBUG
    }

    // Print automatic help.
    if (ctx->help)
    {
        cargo_print_usage(ctx, 0);
        ctx->flags = global_flags;
        return CARGO_PARSE_SHOW_HELP;
    }

    // An option can cause a "hard stop", meaning that there
    // won't be any errors for mutex groups and so on. This is
    // useful for cases where you have --advanced_help or similar
    // where you just want to show some extended help without also
    // having to specify required arguments.
    if (ctx->stopped_hard)
    {
        goto skip_checks;
    }

    if (!(ctx->flags & CARGO_SKIP_CHECK_REQUIRED)
        && _cargo_check_required_options(ctx))
    {
        ret = CARGO_PARSE_MISS_REQUIRED; goto fail;
    }

    if (!(ctx->flags & CARGO_SKIP_CHECK_MUTEX)
        && (ret = _cargo_check_mutex_groups(ctx)))
    {
        goto fail;
    }

    if (!(ctx->flags & CARGO_SKIP_CHECK_UNKNOWN)
        && (ret = _cargo_check_unknown_options_after(ctx)))
    {
        goto fail;
    }

    // Shows warnings.
    if (!(ctx->flags & CARGO_NOWARN))
    {
        _cargo_parse_show_error(ctx);
    }

skip_checks:
    ctx->flags = global_flags;
    return CARGO_PARSE_OK;

fail:
    // Let unknown options override other errors.
    // But don't check for them more than once.
    if (ctx->unknown_opts_count == 0)
    {
        int unknown_ret = 0;
        if (!(ctx->flags & CARGO_SKIP_CHECK_UNKNOWN)
            && (unknown_ret = _cargo_check_unknown_options_after(ctx)))
        {
            CARGODBG(1, "Unknown option overrides previous error\n");
            ret = unknown_ret;
        }
    }

    _cargo_parse_show_error(ctx);
    _cargo_cleanup_option_values(ctx, 1);
    ctx->flags = global_flags;
    return ret;
}